

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

BcOp binop_opcode(Tk binop)

{
  BcOp local_c;
  Tk binop_local;
  
  if (binop == 0x2a) {
    local_c = BC_MUL_LL;
  }
  else if (binop == 0x2b) {
    local_c = BC_ADD_LL;
  }
  else if (binop == 0x2d) {
    local_c = BC_SUB_LL;
  }
  else if (binop == 0x2f) {
    local_c = BC_DIV_LL;
  }
  else if (binop == 0x3c) {
    local_c = BC_LT_LL;
  }
  else if (binop == 0x3e) {
    local_c = BC_GT_LL;
  }
  else if (binop == 0x106) {
    local_c = BC_EQ_LL;
  }
  else if (binop == 0x107) {
    local_c = BC_NEQ_LL;
  }
  else if (binop == 0x108) {
    local_c = BC_LE_LL;
  }
  else {
    if (binop != 0x109) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x176,"BcOp binop_opcode(Tk)");
    }
    local_c = BC_GE_LL;
  }
  return local_c;
}

Assistant:

static BcOp binop_opcode(Tk binop) {
	switch (binop) {
		// Arithmetic operators
		case '+': return BC_ADD_LL;
		case '-': return BC_SUB_LL;
		case '*': return BC_MUL_LL;
		case '/': return BC_DIV_LL;

		// Relational operators
		case TK_EQ:  return BC_EQ_LL;
		case TK_NEQ: return BC_NEQ_LL;
		case '>':    return BC_GT_LL;
		case TK_GE:  return BC_GE_LL;
		case '<':    return BC_LT_LL;
		case TK_LE:  return BC_LE_LL;

		default: UNREACHABLE();
	}
}